

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O3

bool __thiscall spvtools::opt::Instruction::IsOpcodeSafeToDelete(Instruction *this)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = IRContext::IsCombinatorInstruction(this->context_,this);
  bVar2 = true;
  if (((!bVar1) && (8 < this->opcode_ - OpDPdx)) && (this->opcode_ != OpImageQueryLod)) {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Instruction::IsOpcodeSafeToDelete() const {
  if (context()->IsCombinatorInstruction(this)) {
    return true;
  }

  switch (opcode()) {
    case spv::Op::OpDPdx:
    case spv::Op::OpDPdy:
    case spv::Op::OpFwidth:
    case spv::Op::OpDPdxFine:
    case spv::Op::OpDPdyFine:
    case spv::Op::OpFwidthFine:
    case spv::Op::OpDPdxCoarse:
    case spv::Op::OpDPdyCoarse:
    case spv::Op::OpFwidthCoarse:
    case spv::Op::OpImageQueryLod:
      return true;
    default:
      return false;
  }
}